

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O3

int math_modf(lua_State *L)

{
  int iVar1;
  lua_Number lVar2;
  lua_Number d;
  
  iVar1 = lua_isinteger(L,1);
  if (iVar1 == 0) {
    lVar2 = luaL_checknumber(L,1);
    if (0.0 <= lVar2) {
      d = floor(lVar2);
    }
    else {
      d = ceil(lVar2);
    }
    pushnumint(L,d);
    lVar2 = (lua_Number)(~-(ulong)(lVar2 == d) & (ulong)(lVar2 - d));
  }
  else {
    lua_settop(L,1);
    lVar2 = 0.0;
  }
  lua_pushnumber(L,lVar2);
  return 2;
}

Assistant:

static int math_modf(lua_State *L) {
    if (lua_isinteger(L, 1)) {
        lua_settop(L, 1);  /* number is its own integer part */
        lua_pushnumber(L, 0);  /* no fractional part */
    } else {
        lua_Number n = luaL_checknumber(L, 1);
        /* integer part (rounds toward zero) */
        lua_Number ip = (n < 0) ? l_mathop(ceil)(n) : l_mathop(floor)(n);
        pushnumint(L, ip);
        /* fractional part (test needed for inf/-inf) */
        lua_pushnumber(L, (n == ip) ? l_mathop(0.0) : (n - ip));
    }
    return 2;
}